

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_util.cc
# Opt level: O2

bool libwebm::CopyColour(Colour *parser_colour,Colour *muxer_colour)

{
  bool bVar1;
  MasteringMetadata muxer_mm;
  MasteringMetadata local_30;
  
  if (muxer_colour != (Colour *)0x0) {
    if (parser_colour->matrix_coefficients != 0x7fffffffffffffff) {
      muxer_colour->matrix_coefficients_ = parser_colour->matrix_coefficients;
    }
    if (parser_colour->bits_per_channel != 0x7fffffffffffffff) {
      muxer_colour->bits_per_channel_ = parser_colour->bits_per_channel;
    }
    if (parser_colour->chroma_subsampling_horz != 0x7fffffffffffffff) {
      muxer_colour->chroma_subsampling_horz_ = parser_colour->chroma_subsampling_horz;
    }
    if (parser_colour->chroma_subsampling_vert != 0x7fffffffffffffff) {
      muxer_colour->chroma_subsampling_vert_ = parser_colour->chroma_subsampling_vert;
    }
    if (parser_colour->cb_subsampling_horz != 0x7fffffffffffffff) {
      muxer_colour->cb_subsampling_horz_ = parser_colour->cb_subsampling_horz;
    }
    if (parser_colour->cb_subsampling_vert != 0x7fffffffffffffff) {
      muxer_colour->cb_subsampling_vert_ = parser_colour->cb_subsampling_vert;
    }
    if (parser_colour->chroma_siting_horz != 0x7fffffffffffffff) {
      muxer_colour->chroma_siting_horz_ = parser_colour->chroma_siting_horz;
    }
    if (parser_colour->chroma_siting_vert != 0x7fffffffffffffff) {
      muxer_colour->chroma_siting_vert_ = parser_colour->chroma_siting_vert;
    }
    if (parser_colour->range != 0x7fffffffffffffff) {
      muxer_colour->range_ = parser_colour->range;
    }
    if (parser_colour->transfer_characteristics != 0x7fffffffffffffff) {
      muxer_colour->transfer_characteristics_ = parser_colour->transfer_characteristics;
    }
    if (parser_colour->primaries != 0x7fffffffffffffff) {
      muxer_colour->primaries_ = parser_colour->primaries;
    }
    if (parser_colour->max_cll != 0x7fffffffffffffff) {
      muxer_colour->max_cll_ = parser_colour->max_cll;
    }
    if (parser_colour->max_fall != 0x7fffffffffffffff) {
      muxer_colour->max_fall_ = parser_colour->max_fall;
    }
    if (parser_colour->mastering_metadata == (MasteringMetadata *)0x0) {
      return true;
    }
    local_30.luminance_max_ = 3.4028235e+38;
    local_30.luminance_min_ = 3.4028235e+38;
    local_30.r_ = (PrimaryChromaticity *)0x0;
    local_30.g_ = (PrimaryChromaticity *)0x0;
    local_30.b_ = (PrimaryChromaticity *)0x0;
    local_30.white_point_ = (PrimaryChromaticity *)0x0;
    bVar1 = CopyMasteringMetadata(parser_colour->mastering_metadata,&local_30);
    if (bVar1) {
      bVar1 = mkvmuxer::Colour::SetMasteringMetadata(muxer_colour,&local_30);
      mkvmuxer::MasteringMetadata::~MasteringMetadata(&local_30);
      if (bVar1) {
        return true;
      }
    }
    else {
      mkvmuxer::MasteringMetadata::~MasteringMetadata(&local_30);
    }
  }
  return false;
}

Assistant:

bool CopyColour(const mkvparser::Colour& parser_colour,
                mkvmuxer::Colour* muxer_colour) {
  if (!muxer_colour)
    return false;

  if (ColourValuePresent(parser_colour.matrix_coefficients))
    muxer_colour->set_matrix_coefficients(parser_colour.matrix_coefficients);
  if (ColourValuePresent(parser_colour.bits_per_channel))
    muxer_colour->set_bits_per_channel(parser_colour.bits_per_channel);
  if (ColourValuePresent(parser_colour.chroma_subsampling_horz)) {
    muxer_colour->set_chroma_subsampling_horz(
        parser_colour.chroma_subsampling_horz);
  }
  if (ColourValuePresent(parser_colour.chroma_subsampling_vert)) {
    muxer_colour->set_chroma_subsampling_vert(
        parser_colour.chroma_subsampling_vert);
  }
  if (ColourValuePresent(parser_colour.cb_subsampling_horz))
    muxer_colour->set_cb_subsampling_horz(parser_colour.cb_subsampling_horz);
  if (ColourValuePresent(parser_colour.cb_subsampling_vert))
    muxer_colour->set_cb_subsampling_vert(parser_colour.cb_subsampling_vert);
  if (ColourValuePresent(parser_colour.chroma_siting_horz))
    muxer_colour->set_chroma_siting_horz(parser_colour.chroma_siting_horz);
  if (ColourValuePresent(parser_colour.chroma_siting_vert))
    muxer_colour->set_chroma_siting_vert(parser_colour.chroma_siting_vert);
  if (ColourValuePresent(parser_colour.range))
    muxer_colour->set_range(parser_colour.range);
  if (ColourValuePresent(parser_colour.transfer_characteristics)) {
    muxer_colour->set_transfer_characteristics(
        parser_colour.transfer_characteristics);
  }
  if (ColourValuePresent(parser_colour.primaries))
    muxer_colour->set_primaries(parser_colour.primaries);
  if (ColourValuePresent(parser_colour.max_cll))
    muxer_colour->set_max_cll(parser_colour.max_cll);
  if (ColourValuePresent(parser_colour.max_fall))
    muxer_colour->set_max_fall(parser_colour.max_fall);

  if (parser_colour.mastering_metadata) {
    mkvmuxer::MasteringMetadata muxer_mm;
    if (!CopyMasteringMetadata(*parser_colour.mastering_metadata, &muxer_mm))
      return false;
    if (!muxer_colour->SetMasteringMetadata(muxer_mm))
      return false;
  }
  return true;
}